

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Course.hpp
# Opt level: O0

void __thiscall
Course::Course(Course *this,string *newCourseName,int numUnits,string *newCourseDescription,
              string *newCourseRequisites)

{
  string *newCourseRequisites_local;
  string *newCourseDescription_local;
  int numUnits_local;
  string *newCourseName_local;
  Course *this_local;
  
  CourseComponent::CourseComponent(&this->super_CourseComponent);
  (this->super_CourseComponent).super_Observer._vptr_Observer = (_func_int **)&PTR_update_0012a970;
  std::__cxx11::string::string((string *)&this->courseRequisites);
  std::__cxx11::string::operator=
            ((string *)&(this->super_CourseComponent).courseName,(string *)newCourseName);
  (this->super_CourseComponent).courseUnits = numUnits;
  std::__cxx11::string::operator=
            ((string *)&(this->super_CourseComponent).courseDescription,
             (string *)newCourseDescription);
  std::__cxx11::string::operator=((string *)&this->courseRequisites,(string *)newCourseRequisites);
  return;
}

Assistant:

Course(string newCourseName, int numUnits, string newCourseDescription, string newCourseRequisites) : CourseComponent() {
            courseName = newCourseName;
            courseUnits = numUnits;
            courseDescription = newCourseDescription;
            courseRequisites = newCourseRequisites;
        }